

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_context.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  EVP_MD *pEVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  testcase_digest *ptVar8;
  testcase_cipher *ptVar9;
  char *pcVar10;
  long lVar11;
  uchar K [32];
  uchar b [64];
  uchar c [64];
  uchar pt [256];
  undefined1 local_1e0 [8];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 local_138 [264];
  
  uVar7 = 0;
  OPENSSL_init_crypto(0x4c,0);
  pcVar10 = "gost89";
  ptVar9 = testcases_ciphers;
  do {
    ptVar9 = ptVar9 + 1;
    iVar3 = ptVar9[-1].acpkm;
    uVar1 = test_contexts_cipher(pcVar10,1,iVar3);
    uVar2 = test_contexts_cipher(pcVar10,0,iVar3);
    uVar7 = uVar7 | uVar1 | uVar2;
    pcVar10 = ptVar9->name;
  } while (pcVar10 != (char *)0x0);
  ptVar8 = testcases_digests;
  pcVar10 = "md_gost94";
  do {
    if (ptVar8->mac == 0) {
      ERR_set_mark();
      pEVar4 = EVP_get_digestbyname(pcVar10);
      if (pEVar4 == (EVP_MD *)0x0) {
        pEVar4 = (EVP_MD *)EVP_MD_fetch(0,pcVar10,0);
        if (pEVar4 == (EVP_MD *)0x0) {
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("(type = (EVP_MD *)EVP_get_digestbyname(name)) || (type = EVP_MD_fetch(NULL, name, NULL))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                      ,0xf0);
        }
      }
      ERR_pop_to_mark();
      printf("\x1b[1;34mDigest test for %s\x1b[m\n");
      uVar1 = test_contexts_digest_or_legacy_mac((EVP_MD *)pEVar4,0);
      EVP_MD_free(pEVar4);
    }
    else {
      local_1c8 = 0;
      uStack_1c0 = 0;
      local_1d8 = 1;
      uStack_1d0 = 0;
      pEVar4 = EVP_get_digestbyname(pcVar10);
      if (pEVar4 == (EVP_MD *)0x0) {
        lVar5 = EVP_MAC_fetch(0,pcVar10,0);
        if (lVar5 == 0) {
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("mac = EVP_MAC_fetch(NULL, name, NULL)",
                      "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                      ,0x105);
        }
        printf("\x1b[1;34mMac test for %s\x1b[m\n");
        memset(local_138,0,0x100);
        local_138[0] = 1;
        local_188 = 0;
        uStack_180 = 0;
        local_198 = 0;
        uStack_190 = 0;
        local_1a8 = 0;
        uStack_1a0 = 0;
        local_1b8 = 0;
        uStack_1b0 = 0;
        local_148 = 0;
        uStack_140 = 0;
        local_158 = 0;
        uStack_150 = 0;
        local_168 = 0;
        uStack_160 = 0;
        local_178 = 0;
        uStack_170 = 0;
        lVar6 = EVP_MAC_CTX_new(lVar5);
        if (lVar6 == 0) {
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("ctx = EVP_MAC_CTX_new(mac)",
                      "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                      ,0x110);
        }
        iVar3 = EVP_MAC_init(lVar6,&local_1d8,0x20,0);
        if (iVar3 == 0) {
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("EVP_MAC_init(ctx, K, sizeof(K), NULL)",
                      "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                      ,0x111);
        }
        iVar3 = EVP_MAC_update(lVar6,local_138,0x100);
        if (iVar3 == 0) {
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("EVP_MAC_update(ctx, pt, sizeof(pt))",
                      "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                      ,0x112);
        }
        iVar3 = EVP_MAC_final(lVar6,&local_1b8,local_1e0,0x40);
        if (iVar3 == 0) {
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("EVP_MAC_final(ctx, b, &tmplen, sizeof(b))",
                      "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                      ,0x113);
        }
        EVP_MAC_CTX_free(lVar6);
        printf(" cloned contexts: ");
        lVar6 = EVP_MAC_CTX_new(lVar5);
        if (lVar6 == 0) {
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("ctx = EVP_MAC_CTX_new(mac)",
                      "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                      ,0x118);
        }
        iVar3 = EVP_MAC_init(lVar6,&local_1d8,0x20,0);
        if (iVar3 == 0) {
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("EVP_MAC_init(ctx, K, sizeof(K), NULL)",
                      "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                      ,0x119);
        }
        lVar11 = 0;
        do {
          iVar3 = EVP_MAC_update(lVar6,local_138 + lVar11,0x10);
          if (iVar3 == 0) {
            ERR_print_errors_fp(_stderr);
            OPENSSL_die("EVP_MAC_update(ctx, pt + STEP_SIZE * i, STEP_SIZE)",
                        "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                        ,0x11c);
          }
          lVar11 = lVar11 + 0x10;
        } while (lVar11 != 0x100);
        iVar3 = EVP_MAC_final(lVar6,&local_178,local_1e0);
        if (iVar3 == 0) {
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("EVP_MAC_final(ctx, c, &tmplen, sizeof(c))",
                      "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_context.c"
                      ,0x11f);
        }
        EVP_MAC_CTX_free(lVar6);
        EVP_MAC_free(lVar5);
        iVar3 = bcmp(&local_178,&local_1b8,0x40);
        pcVar10 = "\x1b[1;32m  Test passed\x1b[m";
        if (iVar3 != 0) {
          pcVar10 = "\x1b[1;31m  Test FAILED\x1b[m";
        }
        puts(pcVar10);
        if (iVar3 != 0) {
          printf("  b[%d] = ",0x100);
          hexdump(&local_1b8,0x100);
          printf("  c[%d] = ",0x100);
          hexdump(&local_178,0x100);
        }
        uVar1 = (uint)(iVar3 != 0);
      }
      else {
        printf("\x1b[1;34mMac via EVP_MD test for %s\x1b[m\n",pcVar10);
        uVar1 = test_contexts_digest_or_legacy_mac((EVP_MD *)pEVar4,1);
      }
    }
    uVar7 = uVar7 | uVar1;
    pcVar10 = ptVar8[1].name;
    ptVar8 = ptVar8 + 1;
    if (pcVar10 == (char *)0x0) {
      pcVar10 = "\x1b[0;31m= Some tests FAILED!\x1b[m";
      if (uVar7 == 0) {
        pcVar10 = "\x1b[0;32m= All tests passed!\x1b[m";
      }
      puts(pcVar10);
      return uVar7;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    int ret = 0;

    OPENSSL_add_all_algorithms_conf();

    const struct testcase_cipher *tc;
    for (tc = testcases_ciphers; tc->name; tc++) {
	ret |= test_contexts_cipher(tc->name, 1, tc->acpkm);
	ret |= test_contexts_cipher(tc->name, 0, tc->acpkm);
    }
    const struct testcase_digest *td;
    for (td = testcases_digests; td->name; td++) {
        if (td->mac)
            ret |= test_contexts_mac(td->name);
        else
            ret |= test_contexts_digest(td->name);
    }

    if (ret)
	printf(cDRED "= Some tests FAILED!" cNORM "\n");
    else
	printf(cDGREEN "= All tests passed!" cNORM "\n");
    return ret;
}